

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000027f8a0 = 0x2d2d2d2d2d2d2d;
    uRam000000000027f8a7._0_1_ = '-';
    uRam000000000027f8a7._1_1_ = '-';
    uRam000000000027f8a7._2_1_ = '-';
    uRam000000000027f8a7._3_1_ = '-';
    uRam000000000027f8a7._4_1_ = '-';
    uRam000000000027f8a7._5_1_ = '-';
    uRam000000000027f8a7._6_1_ = '-';
    uRam000000000027f8a7._7_1_ = '-';
    DAT_0027f890 = '-';
    DAT_0027f890_1._0_1_ = '-';
    DAT_0027f890_1._1_1_ = '-';
    DAT_0027f890_1._2_1_ = '-';
    DAT_0027f890_1._3_1_ = '-';
    DAT_0027f890_1._4_1_ = '-';
    DAT_0027f890_1._5_1_ = '-';
    DAT_0027f890_1._6_1_ = '-';
    uRam000000000027f898 = 0x2d2d2d2d2d2d2d;
    DAT_0027f89f = 0x2d;
    DAT_0027f880 = '-';
    DAT_0027f880_1._0_1_ = '-';
    DAT_0027f880_1._1_1_ = '-';
    DAT_0027f880_1._2_1_ = '-';
    DAT_0027f880_1._3_1_ = '-';
    DAT_0027f880_1._4_1_ = '-';
    DAT_0027f880_1._5_1_ = '-';
    DAT_0027f880_1._6_1_ = '-';
    uRam000000000027f888._0_1_ = '-';
    uRam000000000027f888._1_1_ = '-';
    uRam000000000027f888._2_1_ = '-';
    uRam000000000027f888._3_1_ = '-';
    uRam000000000027f888._4_1_ = '-';
    uRam000000000027f888._5_1_ = '-';
    uRam000000000027f888._6_1_ = '-';
    uRam000000000027f888._7_1_ = '-';
    DAT_0027f870 = '-';
    DAT_0027f870_1._0_1_ = '-';
    DAT_0027f870_1._1_1_ = '-';
    DAT_0027f870_1._2_1_ = '-';
    DAT_0027f870_1._3_1_ = '-';
    DAT_0027f870_1._4_1_ = '-';
    DAT_0027f870_1._5_1_ = '-';
    DAT_0027f870_1._6_1_ = '-';
    uRam000000000027f878._0_1_ = '-';
    uRam000000000027f878._1_1_ = '-';
    uRam000000000027f878._2_1_ = '-';
    uRam000000000027f878._3_1_ = '-';
    uRam000000000027f878._4_1_ = '-';
    uRam000000000027f878._5_1_ = '-';
    uRam000000000027f878._6_1_ = '-';
    uRam000000000027f878._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000027f868._0_1_ = '-';
    uRam000000000027f868._1_1_ = '-';
    uRam000000000027f868._2_1_ = '-';
    uRam000000000027f868._3_1_ = '-';
    uRam000000000027f868._4_1_ = '-';
    uRam000000000027f868._5_1_ = '-';
    uRam000000000027f868._6_1_ = '-';
    uRam000000000027f868._7_1_ = '-';
    DAT_0027f8af = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}